

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O2

unsigned_long_long measure(string *what,function<unsigned_long_long_()> *cb)

{
  ostream *poVar1;
  
  std::chrono::_V2::system_clock::now();
  std::function<unsigned_long_long_()>::operator()(cb);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)what);
  poVar1 = std::operator<<(poVar1," took ");
  std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," ms");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  return (unsigned_long_long)poVar1;
}

Assistant:

static unsigned long long measure(std::string const& what, std::function<unsigned long long()> const& cb) {
  typedef std::chrono::high_resolution_clock clock;
  std::chrono::time_point<clock> start = clock::now();

  unsigned long long result = cb();

  std::cout << what << " took "
            << std::chrono::duration_cast<std::chrono::milliseconds>(clock::now() - start).count() << " ms" 
            << std::endl;

  return result;
}